

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Bundle::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Bundle *this)

{
  pointer pKVar1;
  pointer pKVar2;
  KStringStream ss;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"***************************************************************",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"PDU Bundle.\nTotal Length: ",0x1a);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"***************************************************************",0x3f);
  pKVar2 = (this->m_vRefHeaders).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar1 = (this->m_vRefHeaders).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar2 != pKVar1) {
    do {
      (*(pKVar2->m_pRef->super_Header6)._vptr_Header6[2])(&local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      pKVar2 = pKVar2 + 1;
    } while (pKVar2 != pKVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"***************************************************************",0x3f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString Bundle::GetAsString()
{
    KStringStream ss;

    ss << "***************************************************************";
    ss << "PDU Bundle.\nTotal Length: " << m_ui16Length;
    ss << "***************************************************************";

    // We only print the PDU, no point in printing the streams.

    //vector<KDataStream>::const_iterator citrObj = m_vStreams.begin();
    //vector<KDataStream>::const_iterator citrObjEnd = m_vStreams.end();
    //for( ; citrObj != citrObjEnd; ++citrObj )
    //{
    //	ss << citrObj->GetAsString();
    //}

    vector<PduPtr>::const_iterator citrRef = m_vRefHeaders.begin();
    vector<PduPtr>::const_iterator citrRefEnd = m_vRefHeaders.end();
    for( ; citrRef != citrRefEnd; ++citrRef )
    {
        ss << ( *citrRef )->GetAsString();
    }

    ss << "***************************************************************";

    return ss.str();
}